

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

CMConnection
CMConnection_create(transport_entry_conflict trans,void *transport_data,attr_list conn_attrs)

{
  CManager p_Var1;
  FILE *pFVar2;
  int iVar3;
  __pid_t _Var4;
  CMConnection conn;
  char *pcVar5;
  FFSBuffer p_Var6;
  AttrBuffer pAVar7;
  CMConnection_conflict *pp_Var8;
  pthread_t pVar9;
  int blocking_on_conn;
  timespec ts;
  int local_44;
  timespec local_40;
  
  conn = (CMConnection)INT_CMmalloc(0x130);
  if (CMConnection_create_first == '\0') {
    pcVar5 = getenv("CMNonBlockWrite");
    CMConnection_create_first = '\x01';
    if (pcVar5 != (char *)0x0) {
      __isoc99_sscanf(pcVar5,"%d",&CMConnection_create::non_block_default);
      iVar3 = CMtrace_val[2];
      if (trans->cm->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(trans->cm,CMConnectionVerbose);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar2 = (FILE *)trans->cm->CMTrace_file;
          _Var4 = getpid();
          pVar9 = pthread_self();
          fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar9);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)trans->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)trans->cm->CMTrace_file,"CM default blocking %d\n",
                (ulong)(uint)CMConnection_create::non_block_default);
      }
      fflush((FILE *)trans->cm->CMTrace_file);
    }
    pcVar5 = getenv("CMReadThread");
    if (pcVar5 != (char *)0x0) {
      __isoc99_sscanf(pcVar5,"%d",&CMConnection_create::read_thread_default);
      iVar3 = CMtrace_val[2];
      if (trans->cm->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(trans->cm,CMConnectionVerbose);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar2 = (FILE *)trans->cm->CMTrace_file;
          _Var4 = getpid();
          pVar9 = pthread_self();
          fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar9);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)trans->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)trans->cm->CMTrace_file,"CM default read thread %d\n",
                (ulong)(uint)CMConnection_create::read_thread_default);
      }
      fflush((FILE *)trans->cm->CMTrace_file);
    }
  }
  conn->cm = trans->cm;
  conn->trans = trans;
  conn->transport_data = transport_data;
  conn->conn_ref_count = 1;
  conn->closed = 0;
  conn->failed = 0;
  conn->preloaded_formats = (FMFormat *)0x0;
  conn->remote_format_server_ID = 0;
  conn->remote_CManager_ID = 0;
  conn->handshake_condition = -1;
  p_Var6 = (FFSBuffer)create_FFSBuffer();
  conn->io_out_buffer = p_Var6;
  conn->close_list = (CMCloseHandlerList)0x0;
  conn->write_callback_len = 0;
  conn->write_callbacks = (CMConnHandlerList)0x0;
  if (conn_attrs != (attr_list)0x0) {
    CMint_add_ref_attr_list
              (conn->cm,conn_attrs,
               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
               ,0x462);
  }
  conn->attrs = conn_attrs;
  pAVar7 = (AttrBuffer)create_AttrBuffer();
  conn->attr_encode_buffer = pAVar7;
  conn->write_pending = 0;
  conn->message_buffer = (CMbuffer)0x0;
  conn->buffer_full_point = 0;
  conn->buffer_data_end = 0;
  conn->characteristics = (attr_list)0x0;
  conn->do_non_blocking_write = CMConnection_create::non_block_default;
  conn->XML_output = 0;
  conn->use_read_thread = CMConnection_create::read_thread_default;
  iVar3 = get_int_attr(conn_attrs,CM_CONN_BLOCKING,&local_44);
  if (iVar3 != 0) {
    conn->do_non_blocking_write = (uint)(local_44 == 0);
  }
  p_Var1 = trans->cm;
  pp_Var8 = (CMConnection_conflict *)
            INT_CMrealloc(p_Var1->connections,(long)p_Var1->connection_count * 8 + 8);
  p_Var1->connections = pp_Var8;
  pp_Var8[p_Var1->connection_count] = conn;
  INT_CMConnection_add_reference(conn);
  p_Var1->connection_count = p_Var1->connection_count + 1;
  iVar3 = CMtrace_val[7];
  if (trans->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(trans->cm,CMFreeVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar2 = (FILE *)trans->cm->CMTrace_file;
      _Var4 = getpid();
      pVar9 = pthread_self();
      fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar9);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)trans->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)trans->cm->CMTrace_file,"CMConnection_create %p \n",conn);
  }
  fflush((FILE *)trans->cm->CMTrace_file);
  return conn;
}

Assistant:

CMConnection
 CMConnection_create(transport_entry trans, void *transport_data, 
		     attr_list conn_attrs)
 {
     static int first = 1;
     static int non_block_default = 0;
     static int read_thread_default = 0;
     int blocking_on_conn;
     CMConnection conn = INT_CMmalloc(sizeof(struct _CMConnection));
     if (first) {
	 char *value = getenv("CMNonBlockWrite");
	 first = 0;
	 if (value != NULL) {
	     sscanf(value, "%d", &non_block_default);
	     CMtrace_out(trans->cm, CMConnectionVerbose, "CM default blocking %d\n",
			 non_block_default);
	 }
	 value = getenv("CMReadThread");
	 if (value != NULL) {
	     sscanf(value, "%d", &read_thread_default);
	     CMtrace_out(trans->cm, CMConnectionVerbose, "CM default read thread %d\n",
			 read_thread_default);
	 }
     }
     conn->cm = trans->cm;
     conn->trans = trans;
     conn->transport_data = transport_data;
     conn->conn_ref_count = 1;
     conn->closed = 0;
     conn->failed = 0;
     conn->preloaded_formats = NULL;
     conn->remote_format_server_ID = 0;
     conn->remote_CManager_ID = 0;
     conn->handshake_condition = -1;
     conn->io_out_buffer = create_FFSBuffer();
     conn->close_list = NULL;
     conn->write_callback_len = 0;
     conn->write_callbacks = NULL;
     if (conn_attrs) {
	 CMadd_ref_attr_list(conn->cm, conn_attrs);
     }
     conn->attrs = conn_attrs;
     conn->attr_encode_buffer = create_AttrBuffer();

     conn->message_buffer = NULL;
     conn->buffer_full_point = 0;
     conn->buffer_data_end = 0;

     conn->characteristics = NULL;
     conn->write_pending = 0;
     conn->do_non_blocking_write = non_block_default;
     conn->XML_output = 0;
     conn->use_read_thread = read_thread_default; 

     if (get_int_attr(conn_attrs, CM_CONN_BLOCKING, &blocking_on_conn)) {
	 conn->do_non_blocking_write = !blocking_on_conn;
     }
     add_conn_to_CM(trans->cm, conn);
     CMtrace_out(trans->cm, CMFreeVerbose, "CMConnection_create %p \n",
		 conn);
     return conn;
 }